

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O2

void cuddLocalCacheQuit(DdLocalCache *cache)

{
  DdManager *pDVar1;
  DdLocalCache *pDVar2;
  DdLocalCache **ppDVar3;
  DdLocalCache **ppDVar4;
  
  pDVar1 = cache->manager;
  pDVar1->memused = (pDVar1->memused - (ulong)(cache->itemsize * cache->slots)) - 0x48;
  ppDVar3 = &pDVar1->localCaches;
  do {
    ppDVar4 = ppDVar3;
    pDVar2 = *ppDVar4;
    if (pDVar2 == (DdLocalCache *)0x0) goto LAB_0061ce57;
    ppDVar3 = &pDVar2->next;
  } while (pDVar2 != cache);
  *ppDVar4 = pDVar2->next;
LAB_0061ce57:
  free(cache->item);
  free(cache);
  return;
}

Assistant:

void
cuddLocalCacheQuit(
  DdLocalCache * cache /* cache to be shut down */)
{
    cache->manager->memused -=
        cache->slots * cache->itemsize + sizeof(DdLocalCache);
    cuddLocalCacheRemoveFromList(cache);
    ABC_FREE(cache->item);
    ABC_FREE(cache);

    return;

}